

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_writer::
w_chunks<std::vector<xray_re::way_path*,std::allocator<xray_re::way_path*>>,xray_re::way_path_io>
          (xr_writer *this,undefined8 *container)

{
  undefined8 *puVar1;
  uint32_t id;
  way_path_io local_29;
  
  puVar1 = (undefined8 *)container[1];
  id = 0;
  for (container = (undefined8 *)*container; container != puVar1; container = container + 1) {
    open_chunk(this,id);
    way_path_io::operator()(&local_29,(way_path *)*container,this);
    close_chunk(this);
    id = id + 1;
  }
  return;
}

Assistant:

inline void xr_writer::w_chunks(const T& container, F write)
{
	typename T::const_iterator it = container.begin(), end = container.end();
	for (uint32_t id = 0; it != end; ++it) {
		open_chunk(id++);
		write(*it, *this);
		close_chunk();
	}
}